

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O0

type LBFGS(Mesh *mesh,VectorXd *x,double *error)

{
  double v_00;
  int iVar1;
  bool bVar2;
  long lVar3;
  Index IVar4;
  Scalar *pSVar5;
  reference pvVar6;
  int *piVar7;
  ostream *poVar8;
  void *this;
  Index extraout_RDX;
  double *in_RDI;
  undefined1 *puVar9;
  ReturnType RVar10;
  ReturnType RVar11;
  RealScalar RVar12;
  undefined1 auVar13 [16];
  ConstFaceVertexRange CVar14;
  type tVar15;
  double energy;
  double step_len;
  double beta;
  int i_2;
  int i_1;
  VectorXd r;
  VectorXd gradx0;
  VectorXd q;
  value_type v;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __end3;
  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  __begin3;
  ConstFaceVertexRange *__range3;
  VertexHandle handles [10];
  int cnt;
  value_type face;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __end2;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
  __begin2;
  ConstFaceRange *__range2;
  Vec3f vert;
  int i;
  Mesh omesh;
  int step;
  int k;
  VectorXd gradx;
  double epsilon;
  double alphas [7];
  double rhos [7];
  VectorXd ys [7];
  VectorXd ss [7];
  anon_class_8_1_a7dec128 test;
  double in_stack_00000d98;
  VectorXd *in_stack_00000da0;
  Mesh *in_stack_00000da8;
  undefined4 in_stack_fffffffffffff6f8;
  int in_stack_fffffffffffff6fc;
  undefined4 in_stack_fffffffffffff700;
  BaseHandle in_stack_fffffffffffff704;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff708;
  Matrix<double,__1,_1,_0,__1,_1> *in_stack_fffffffffffff710;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *in_stack_fffffffffffff718;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff720;
  CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
  *in_stack_fffffffffffff728;
  streamsize in_stack_fffffffffffff738;
  undefined1 *puVar16;
  StorageBaseType *in_stack_fffffffffffff740;
  string *in_stack_fffffffffffff748;
  PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *in_stack_fffffffffffff750;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff758;
  VectorXd *in_stack_fffffffffffff798;
  Mesh *in_stack_fffffffffffff7a0;
  BaseHandle *local_7d0;
  undefined1 *local_720;
  undefined1 *local_6e8;
  double in_stack_fffffffffffff948;
  double *in_stack_fffffffffffff950;
  VectorXd *in_stack_fffffffffffff958;
  VectorXd *in_stack_fffffffffffff960;
  VectorXd *in_stack_fffffffffffff968;
  Mesh *in_stack_fffffffffffff970;
  int local_604 [3];
  double local_5f8;
  int local_58c [3];
  Index local_580;
  undefined1 in_stack_fffffffffffffa97;
  double in_stack_fffffffffffffa98;
  VectorXd *in_stack_fffffffffffffaa0;
  Mesh *in_stack_fffffffffffffaa8;
  Options local_544;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  undefined4 local_4c0;
  BaseHandle local_4bc;
  PolyConnectivity *local_488;
  BaseHandle local_480;
  int local_474;
  PolyConnectivity *local_470;
  BaseHandle local_468;
  PolyConnectivity **local_460;
  BaseHandle local_458 [10];
  BaseHandle local_430;
  int local_42c;
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  PolyConnectivity *local_408;
  PolyConnectivity **local_400;
  BaseHandle local_3f4;
  VectorT<float,3> local_3f0 [12];
  int local_3e4;
  PolyConnectivity local_3e0;
  int local_1b8;
  int local_1b4;
  double local_1a0;
  double adStack_198 [8];
  double adStack_158 [8];
  undefined1 local_118 [112];
  undefined1 auStack_a8 [16];
  undefined1 local_98 [112];
  undefined1 local_28 [40];
  
  local_6e8 = local_98;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d233e);
    local_6e8 = local_6e8 + 0x10;
  } while (local_6e8 != local_28);
  local_720 = local_118;
  do {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d239d);
    local_720 = local_720 + 0x10;
  } while (local_720 != auStack_a8);
  local_1a0 = getAveLen(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  local_1a0 = local_1a0 * 0.25;
  calcGrad(in_stack_00000da8,in_stack_00000da0,in_stack_00000d98);
  local_1b4 = 0;
  local_1b8 = 0;
  do {
    OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>::PolyMesh_ArrayKernelT
              ((PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
    local_3e4 = 0;
    while( true ) {
      lVar3 = (long)local_3e4;
      IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                         CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
      if (IVar4 <= lVar3) break;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      v_00 = *pSVar5;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      OpenMesh::VectorT<float,3>::VectorT<double,double,float,void,void>(local_3f0,v_00,*pSVar5,0.0)
      ;
      local_3f4.idx_ =
           (int)OpenMesh::
                PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>_>
                ::add_vertex((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>_>
                              *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                             (Point *)0x1d2529);
      local_3e4 = local_3e4 + 2;
    }
    local_408 = (PolyConnectivity *)
                OpenMesh::PolyConnectivity::all_faces
                          ((PolyConnectivity *)
                           CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    local_400 = &local_408;
    auVar13 = OpenMesh::PolyConnectivity::
              EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
              ::begin((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                       *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
    local_418 = auVar13;
    auVar13 = OpenMesh::PolyConnectivity::
              EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
              ::end((EntityRange<const_OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>,_&OpenMesh::PolyConnectivity::faces_begin,_&OpenMesh::PolyConnectivity::faces_end>
                     *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
    local_428 = auVar13;
    while( true ) {
      bVar2 = OpenMesh::Iterators::
              GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
              ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                           (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      if (!bVar2) break;
      pvVar6 = OpenMesh::Iterators::
               GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
               ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                            *)local_418);
      local_42c = (pvVar6->super_BaseHandle).idx_;
      local_430.idx_ = 0;
      local_7d0 = local_458;
      do {
        OpenMesh::VertexHandle::VertexHandle
                  ((VertexHandle *)
                   CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                   in_stack_fffffffffffff6fc);
        local_7d0 = local_7d0 + 1;
      } while (local_7d0 != &local_430);
      local_474 = local_42c;
      CVar14 = OpenMesh::PolyConnectivity::fv_range
                         ((PolyConnectivity *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                          (FaceHandle)in_stack_fffffffffffff704.idx_);
      local_488 = CVar14.container_;
      local_480.idx_ = (int)CVar14.center_.super_BaseHandle.idx_;
      local_460 = &local_470;
      local_470 = local_488;
      local_468.idx_ = local_480.idx_;
      OpenMesh::PolyConnectivity::
      CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
      ::begin(in_stack_fffffffffffff728);
      OpenMesh::PolyConnectivity::
      CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
      ::end(in_stack_fffffffffffff728);
      while( true ) {
        bVar2 = OpenMesh::Iterators::
                GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                ::operator!=((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                              *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                             (GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                              *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
        if (!bVar2) break;
        local_4bc.idx_ =
             (int)OpenMesh::Iterators::
                  GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                               *)in_stack_fffffffffffff708);
        lVar3 = (long)local_430.idx_;
        local_430.idx_ = local_430.idx_ + 1;
        local_458[lVar3].idx_ = local_4bc.idx_;
        OpenMesh::Iterators::
        GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
      }
      local_4c0 = OpenMesh::PolyConnectivity::add_face
                            (&local_3e0,(VertexHandle *)local_458,(long)local_430.idx_);
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
    }
    if ((local_1b4 % 10 == 0) || (local_1b4 == 1)) {
      std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff748 >> 0x20));
      std::operator+(in_stack_fffffffffffff708,
                     (char *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
      std::operator+(in_stack_fffffffffffff708,
                     (char *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
      std::operator+(in_stack_fffffffffffff708,
                     (char *)CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
      OpenMesh::IO::Options::Options(&local_544,Default);
      OpenMesh::IO::write_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
                (in_stack_fffffffffffff750,in_stack_fffffffffffff748,
                 (Options *)in_stack_fffffffffffff740,in_stack_fffffffffffff738);
      OpenMesh::IO::Options::~Options(&local_544);
      std::__cxx11::string::~string(local_4e0);
      std::__cxx11::string::~string(local_500);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_540);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    local_580 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::size
                          ((EigenBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                           CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>
              (in_stack_fffffffffffff710,(long *)in_stack_fffffffffffff708);
    local_58c[2] = local_1b4;
    while( true ) {
      local_58c[2] = local_58c[2] + -1;
      iVar1 = local_58c[2];
      local_58c[1] = 0;
      local_58c[0] = local_1b4 + -7;
      piVar7 = std::max<int>(local_58c + 1,local_58c);
      if (iVar1 < *piVar7) break;
      RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
               dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      adStack_198[local_58c[2] % 7] = RVar10 * adStack_158[local_58c[2] % 7];
      Eigen::operator*((double *)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
                (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
    }
    if (local_1b4 == 0) {
      Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                 (Matrix<double,__1,_1,_0,__1,_1> *)
                 CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    }
    else {
      RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
               dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      RVar11 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
               dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                         ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                          (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                          CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      local_5f8 = RVar10 / RVar11;
      Eigen::operator*((double *)in_stack_fffffffffffff748,in_stack_fffffffffffff740);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)
                 CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    }
    local_604[1] = 0;
    local_604[0] = local_1b4 + -7;
    piVar7 = std::max<int>(local_604 + 1,local_604);
    for (local_604[2] = *piVar7; local_604[2] < local_1b4; local_604[2] = local_604[2] + 1) {
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                (in_stack_fffffffffffff758,(double *)in_stack_fffffffffffff750);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                (in_stack_fffffffffffff720,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)in_stack_fffffffffffff718);
    }
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator-
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff718);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (EigenBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    getStepLength(in_stack_fffffffffffff970,in_stack_fffffffffffff968,in_stack_fffffffffffff960,
                  in_stack_fffffffffffff958,in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d30c0);
    getEnergy(in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,
              (bool)in_stack_fffffffffffffa97);
    poVar8 = std::operator<<((ostream *)std::cout,"Step: ");
    iVar1 = local_1b8;
    local_1b8 = local_1b8 + 1;
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar1);
    poVar8 = std::operator<<(poVar8," Norm of Gradient: ");
    RVar12 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    this = (void *)std::ostream::operator<<(poVar8,RVar12);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator-
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff718);
    Eigen::operator*((double *)in_stack_fffffffffffff748,
                     (StorageBaseType *)in_stack_fffffffffffff740);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              (in_stack_fffffffffffff720,
               (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff718);
    calcGrad(in_stack_00000da8,in_stack_00000da0,in_stack_00000d98);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d32dc);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
              ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff728,
               in_stack_fffffffffffff720);
    Eigen::Matrix<double,-1,1,0,-1,1>::operator=
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    RVar10 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
             dot<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                        (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
    adStack_158[local_1b4 % 7] = 1.0 / RVar10;
    local_1b4 = local_1b4 + 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d33da);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d33e7);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d33f4);
    OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>::~PolyMesh_ArrayKernelT
              ((PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits> *)0x1d3401);
    bVar2 = LBFGS::anon_class_8_1_a7dec128::operator()
                      ((anon_class_8_1_a7dec128 *)
                       CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
                       (VectorXd *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  } while (bVar2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
            ((Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffff704.idx_,in_stack_fffffffffffff700),
             (Matrix<double,__1,_1,_0,__1,_1> *)
             CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8));
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d344c);
  puVar16 = local_118;
  puVar9 = auStack_a8;
  do {
    puVar9 = puVar9 + -0x10;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d34db);
  } while (puVar9 != puVar16);
  puVar16 = local_98;
  puVar9 = local_28;
  do {
    puVar9 = puVar9 + -0x10;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x1d3559);
  } while (puVar9 != puVar16);
  tVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  tVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = in_RDI;
  return (type)tVar15.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto LBFGS(Mesh& mesh, Eigen::VectorXd x, const double& error) {
    static constexpr int sz = 7;
    auto test = [&error](const Eigen::VectorXd& x) -> bool {
        return x.norm() > error;
    };

    Eigen::VectorXd ss[sz], ys[sz];
    double rhos[sz], alphas[sz];
    double epsilon = getAveLen(mesh, x) * 0.25f;
    Eigen::VectorXd gradx = calcGrad(mesh, x, epsilon);
    int k = 0;
    int step = 0;
    do{
        // Write intermediate result if test mode is enabled
        #ifdef TEST
            Mesh omesh;
            for (int i = 0; i < x.size(); i += 2) {
                OpenMesh::Vec3f vert(x[i], x[i + 1], 0.0f);
                omesh.add_vertex(vert);
            }
            for (auto face: mesh.all_faces()) {
                int cnt = 0;
                OpenMesh::VertexHandle handles[10];
                for (auto v: mesh.fv_range(face)) 
                    handles[cnt++] = v;
                omesh.add_face(handles, cnt);
            }
            if(k % 10 == 0 || k == 1)
                OpenMesh::IO::write_mesh(omesh, std::to_string(k) + "test" + "_param" +  ".obj");
        #endif
        auto q = gradx;
        auto gradx0 = gradx;
        Eigen::VectorXd r(x.size());
        for (int i = k - 1; i >= std::max(0, k - sz); --i) {
            alphas[i % sz] = q.dot(ss[i % sz]) * rhos[i % sz];
            q -= alphas[i % sz] * ys[i % sz]; 
        }
        if (k == 0)
            r = q;
        else r = ss[(k - 1) % sz].dot(ys[(k - 1) % sz]) / ys[(k - 1) % sz].dot(ys[(k - 1) % sz]) * q;
        for (int i = std::max(0, k - sz); i < k; ++i) {
            auto beta = rhos[i % sz] * r.dot(ys[i %sz]);
            r += ss[i % sz] * (alphas[i % sz] - beta);
        }
        double step_len = getStepLength(mesh, x, -r, gradx0, epsilon, k == 0 ? 1e-5 : 1.0);
        auto energy = getEnergy(mesh, x, epsilon, true);
        #ifdef TEST
            std::cout << "Step: " << step++ << " Norm of Gradient: "<< gradx.norm() << std::endl;
        #endif
        // update array for y, s, rho
        ss[k % sz] = step_len * -r;
        x += ss[k % sz];
        gradx = calcGrad(mesh, x, epsilon);
        ys[k % sz] = gradx - gradx0;
        rhos[k % sz] = 1.0 / ss[k % sz].dot(ys[k % sz]);
       
        ++k;
    }while(test(gradx));

    return std::move(x);
}